

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ast.cpp
# Opt level: O1

void __thiscall PrintAST::visit(PrintAST *this,PrintNode *node)

{
  ExpListNode *pEVar1;
  
  printAST(this,"PRINT_LN");
  this->level = this->level + 1;
  pEVar1 = node->list;
  if (pEVar1 != (ExpListNode *)0x0) {
    (*(pEVar1->super_ASTNode)._vptr_ASTNode[3])(pEVar1,this);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintAST::visit(PrintNode *node) {
    this->printAST("PRINT_LN");
    up_level();
    if (node->getExpList() != nullptr) {
        node->getExpList()->accept(this);
    }
    down_level();
}